

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcs.c
# Opt level: O1

void mcswrt(mcscxdef *ctx,mcsdsdef *desc,uchar *buf,ushort bufl)

{
  int iVar1;
  size_t sVar2;
  undefined6 in_register_0000000a;
  int iVar3;
  
  desc->mcsdsosz = bufl;
  iVar3 = 1;
  while( true ) {
    iVar1 = fseek((FILE *)ctx->mcscxfp,desc->mcsdsptr,0);
    if (iVar1 != 0) {
      errsigf(ctx->mcscxerr,"TADS",2);
    }
    sVar2 = fwrite(buf,CONCAT62(in_register_0000000a,bufl) & 0xffffffff,1,(FILE *)ctx->mcscxfp);
    if (sVar2 == 1) break;
    mcscompact(ctx);
    iVar3 = iVar3 + -1;
    if (iVar3 != 0) {
      errsigf(ctx->mcscxerr,"TADS",7);
    }
  }
  return;
}

Assistant:

void mcswrt(mcscxdef *ctx, mcsdsdef *desc, uchar *buf, ushort bufl)
{
    int tries;
    
    desc->mcsdsosz = bufl;
    
    for (tries = 0 ; tries < 2 ; ++tries)
    {
        /* attempt to write the object to the swap file */
        if (osfseek(ctx->mcscxfp, desc->mcsdsptr, OSFSK_SET))
            errsig(ctx->mcscxerr, ERR_FSEEK);
        if (!osfwb(ctx->mcscxfp, buf, (size_t)bufl))
            return;
        
        /* couldn't write it; compact the swap file */
        mcscompact(ctx);
    }
    
    /* couldn't write to swap file, even after compacting it */
    errsig(ctx->mcscxerr, ERR_FWRITE);
}